

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O3

void dump_elist(char *name,zt_elist_t *p)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  char *__format;
  zt_elist_t *pzVar6;
  
  iVar5 = 0;
  printf("%s %p [",name,p);
  pzVar6 = p->next;
  if (pzVar6 != p) {
    bVar2 = true;
    do {
      bVar1 = false;
      if (pzVar6->next != p) {
        bVar1 = bVar2;
      }
      pcVar4 = "";
      if (bVar1) {
        pcVar4 = ", ";
      }
      __format = "%p%s";
      if (((ulong)pzVar6[1].prev & 2) != 0) {
        __format = "p(%p)%s";
      }
      printf(__format,pzVar6,pcVar4);
      if (iVar5 < 9) {
        iVar5 = iVar5 + 1;
      }
      else {
        sVar3 = strlen(name);
        iVar5 = 0;
        printf("\n%*s",(ulong)((int)sVar3 + 2),"");
      }
      pzVar6 = pzVar6->next;
      bVar2 = bVar1;
    } while (pzVar6 != p);
  }
  puts("]");
  return;
}

Assistant:

static void
dump_elist(char *name, zt_elist_t *p)
{
    zt_elist_t * tmp;
    int        c;
    int        count;

    printf("%s %p [", name, (void *)p);
    c = 1;
    count = 0;
    zt_elist_for_each(p, tmp) {
        if (tmp->next == p) {
            c = 0;
        }
        if (is_protected(zt_elist_data(tmp, zt_gc_collectable_t, list))) {
            printf("p(%p)%s", (void *)tmp, c ? ", " : "");
        } else {
            printf("%p%s", (void *)tmp, c ? ", " : "");
        }
        if (++count >= 10) {
            printf("\n" BLANK, INDENT_TO(strlen(name) + 2, 1, 0));
            count = 0;
        }
    }
    printf("]\n");
}